

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

void duckdb::BitpackingFetchRow<short>
               (ColumnSegment *segment,ColumnFetchState *state,row_t row_id,Vector *result,
               idx_t result_idx)

{
  BitpackingScanState<short,_short> *this;
  short *psVar1;
  long in_R8;
  bool cast;
  short multiplier;
  bool skip_sign_extend;
  data_ptr_t decompression_group_start_pointer;
  idx_t offset_in_compression_group;
  short *current_result_ptr;
  short *result_data;
  BitpackingScanState<short,_short> scan_state;
  undefined7 in_stack_ffffffffffffef28;
  undefined1 in_stack_ffffffffffffef2f;
  short local_10b2;
  idx_t in_stack_ffffffffffffef80;
  ColumnSegment *in_stack_ffffffffffffef88;
  BitpackingScanState<short,_short> *in_stack_ffffffffffffef90;
  ColumnSegment *in_stack_ffffffffffffefa8;
  BitpackingScanState<short,_short> *in_stack_ffffffffffffefb0;
  char local_50;
  short local_46;
  short local_44;
  short local_42;
  ulong local_40;
  
  BitpackingScanState<short,_short>::BitpackingScanState
            (in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8);
  NumericCast<unsigned_long,long,void>(0xa795fb);
  BitpackingScanState<short,_short>::Skip
            (in_stack_ffffffffffffef90,in_stack_ffffffffffffef88,in_stack_ffffffffffffef80);
  this = (BitpackingScanState<short,_short> *)FlatVector::GetData<short>((Vector *)0xa79625);
  psVar1 = this->decompression_buffer + in_R8 + -0x14;
  if (local_50 == '\x02') {
    *psVar1 = local_44;
  }
  else if (local_50 == '\x03') {
    TryCast::Operation<unsigned_long,short>
              ((uint64_t)this,
               (int16_t *)CONCAT17(in_stack_ffffffffffffef2f,in_stack_ffffffffffffef28),false);
    *psVar1 = local_10b2 * local_44 + local_46;
  }
  else {
    data_ptr_cast<short>((short *)&stack0xffffffffffffefb0);
    BitpackingPrimitives::UnPackBlock<short>
              ((data_ptr_t)this,
               (data_ptr_t)CONCAT17(in_stack_ffffffffffffef2f,in_stack_ffffffffffffef28),'\0',false)
    ;
    *psVar1 = *(short *)(&stack0xffffffffffffefb0 + (local_40 & 0x1f) * 2);
    *psVar1 = *psVar1 + local_46;
    if (local_50 == '\x04') {
      *psVar1 = *psVar1 + local_42;
    }
  }
  BitpackingScanState<short,_short>::~BitpackingScanState(this);
  return;
}

Assistant:

void BitpackingFetchRow(ColumnSegment &segment, ColumnFetchState &state, row_t row_id, Vector &result,
                        idx_t result_idx) {
	BitpackingScanState<T> scan_state(segment);
	scan_state.Skip(segment, NumericCast<idx_t>(row_id));

	D_ASSERT(scan_state.current_group_offset < BITPACKING_METADATA_GROUP_SIZE);

	D_ASSERT(result.GetVectorType() == VectorType::FLAT_VECTOR);
	T *result_data = FlatVector::GetData<T>(result);
	T *current_result_ptr = result_data + result_idx;

	idx_t offset_in_compression_group =
	    scan_state.current_group_offset % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;

	data_ptr_t decompression_group_start_pointer =
	    scan_state.current_group_ptr +
	    (scan_state.current_group_offset - offset_in_compression_group) * scan_state.current_width / 8;

	//! Because FOR offsets all our values to be 0 or above, we can always skip sign extension here
	bool skip_sign_extend = true;

	if (scan_state.current_group.mode == BitpackingMode::CONSTANT) {
		*current_result_ptr = scan_state.current_constant;
		return;
	}

	if (scan_state.current_group.mode == BitpackingMode::CONSTANT_DELTA) {
		T multiplier;
		auto cast = TryCast::Operation<idx_t, T>(scan_state.current_group_offset, multiplier);
		(void)cast;
		D_ASSERT(cast);
#ifdef DEBUG
		// overflow check
		T result;
		bool multiply = TryMultiplyOperator::Operation(multiplier, scan_state.current_constant, result);
		bool add = TryAddOperator::Operation(result, scan_state.current_frame_of_reference, result);
		D_ASSERT(multiply && add);
#endif
		*current_result_ptr = (multiplier * scan_state.current_constant) + scan_state.current_frame_of_reference;
		return;
	}

	D_ASSERT(scan_state.current_group.mode == BitpackingMode::FOR ||
	         scan_state.current_group.mode == BitpackingMode::DELTA_FOR);

	BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(scan_state.decompression_buffer),
	                                     decompression_group_start_pointer, scan_state.current_width, skip_sign_extend);

	*current_result_ptr = scan_state.decompression_buffer[offset_in_compression_group];
	*current_result_ptr += scan_state.current_frame_of_reference;

	if (scan_state.current_group.mode == BitpackingMode::DELTA_FOR) {
		*current_result_ptr += scan_state.current_delta_offset;
	}
}